

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * rw::Image::create(int32 width,int32 height,int32 depth)

{
  FILE *__stream;
  char *pcVar1;
  int local_3c;
  Error local_30;
  Error _e;
  Image *img;
  int32 depth_local;
  int32 height_local;
  int32 width_local;
  
  _e = (Error)malloc_LOC(0x28,0x30018,
                         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 53"
                        );
  if (_e == (Error)0x0) {
    local_30.plugin = 0x18;
    local_30.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp",0x37);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,0x28);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_30);
    height_local = 0;
    width_local = 0;
  }
  else {
    numAllocated = numAllocated + 1;
    *(undefined4 *)_e = 0;
    *(int32 *)((long)_e + 4) = width;
    *(int32 *)((long)_e + 8) = height;
    *(int32 *)((long)_e + 0xc) = depth;
    if (depth < 8) {
      local_3c = 1;
    }
    else {
      local_3c = depth / 8;
    }
    *(int *)((long)_e + 0x10) = local_3c;
    *(int32 *)((long)_e + 0x14) = 0;
    *(uint8 **)((long)_e + 0x18) = (uint8 *)0x0;
    *(uint8 **)((long)_e + 0x20) = (uint8 *)0x0;
    _height_local = _e;
  }
  return (Image *)_height_local;
}

Assistant:

Image*
Image::create(int32 width, int32 height, int32 depth)
{
	Image *img = (Image*)rwMalloc(sizeof(Image), MEMDUR_EVENT | ID_IMAGE);
	if(img == nil){
		RWERROR((ERR_ALLOC, sizeof(Image)));
		return nil;
	}
	numAllocated++;
	img->flags = 0;
	img->width = width;
	img->height = height;
	img->depth = depth;
	img->bpp = depth < 8 ? 1 : depth/8;
	img->stride = 0;
	img->pixels = nil;
	img->palette = nil;
	return img;
}